

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,CVmNetFile *nf,vm_val_t *filespec,int quiet,int script_more_mode)

{
  script_stack_entry *psVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  script_stack_entry *psVar6;
  vm_globalvar_t *pvVar7;
  char buf [50];
  int local_7c;
  int local_78;
  undefined7 local_68;
  undefined1 uStack_61;
  undefined7 uStack_60;
  
  iVar4 = 1;
  if (nf != (CVmNetFile *)0x0) {
    __stream = fopen(nf->lclfname,"r");
    if (__stream == (FILE *)0x0) {
      CVmNetFile::abandon(nf);
    }
    else {
      pcVar5 = fgets((char *)&local_68,0x32,__stream);
      if ((pcVar5 == (char *)0x0) ||
         (CONCAT71(uStack_60,uStack_61) != 0xa3e7470697263 ||
          CONCAT17(uStack_61,local_68) != 0x6373746e6576653c)) {
        local_78 = 0;
        fseek(__stream,0,0);
      }
      else {
        local_78 = 1;
      }
      psVar1 = this->script_sp_;
      local_7c = quiet;
      if (psVar1 != (script_stack_entry *)0x0) {
        if (psVar1->quiet != 0) {
          quiet = 1;
        }
        local_7c = quiet;
        if (psVar1->more_mode == 0) {
          script_more_mode = 0;
        }
      }
      psVar6 = (script_stack_entry *)operator_new(0x30);
      iVar4 = (*this->_vptr_CVmConsole[4])(this,(ulong)(uint)script_more_mode);
      psVar6->enc = psVar1;
      psVar6->old_more_mode = iVar4;
      psVar6->netfile = nf;
      psVar6->fp = (osfildef *)__stream;
      psVar6->more_mode = script_more_mode;
      psVar6->quiet = local_7c;
      psVar6->event_script = local_78;
      psVar6->filespec = (vm_globalvar_t *)0x0;
      if (filespec != (vm_val_t *)0x0) {
        pvVar7 = CVmObjTable::create_global_var(&G_obj_table_X);
        psVar6->filespec = pvVar7;
        uVar3 = *(undefined4 *)&filespec->field_0x4;
        aVar2 = filespec->val;
        (pvVar7->val).typ = filespec->typ;
        *(undefined4 *)&(pvVar7->val).field_0x4 = uVar3;
        (pvVar7->val).val = aVar2;
      }
      this->script_sp_ = psVar6;
      iVar4 = 0;
      if (script_more_mode == 0) {
        os_nonstop_mode(1);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int CVmConsole::open_script_file(VMG_ CVmNetFile *nf, const vm_val_t *filespec,
                                 int quiet, int script_more_mode)
{
    int evt;
    char buf[50];
    
    /* if the network file open failed, return an error */
    if (nf == 0)
        return 1;

    /* open the local file */
    osfildef *fp = osfoprt(nf->lclfname, OSFTCMD);

    /* if that failed, silently ignore the request */
    if (fp == 0)
    {
        /* abandon the network file descriptor and return failure */
        nf->abandon(vmg0_);
        return 1;
    }

    /* read the first line to see if it looks like an event script */
    if (osfgets(buf, sizeof(buf), fp) != 0
        && strcmp(buf, "<eventscript>\n") == 0)
    {
        /* remember that it's an event script */
        evt = TRUE;
    }
    else
    {
        /* 
         *   it's not an event script, so it must be a regular command-line
         *   script - rewind it so we read the first line again as a regular
         *   input line 
         */
        evt = FALSE;
        osfseek(fp, 0, OSFSK_SET);
    }

    /* if there's an enclosing script, inherit its modes */
    if (script_sp_ != 0)
    {
        /* 
         *   if the enclosing script is quiet, force the nested script to be
         *   quiet as well 
         */
        if (script_sp_->quiet)
            quiet = TRUE;

        /* 
         *   if the enclosing script is nonstop, force the nested script to
         *   be nonstop as well
         */
        if (!script_sp_->more_mode)
            script_more_mode = FALSE;
    }

    /* push the new script file onto the stack */
    script_sp_ = new script_stack_entry(
        vmg_ script_sp_, set_more_state(script_more_mode), nf, fp, filespec,
        script_more_mode, quiet, evt);
    
    /* turn on NONSTOP mode in the OS layer if applicable */
    if (!script_more_mode)
        os_nonstop_mode(TRUE);

    /* success */
    return 0;
}